

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void __thiscall
QGraphicsScenePrivate::grabGesture
          (QGraphicsScenePrivate *this,QGraphicsItem *param_1,GestureType gesture)

{
  byte bVar1;
  int iVar2;
  Entry *pEVar3;
  long lVar4;
  QGraphicsView **ppQVar5;
  QWidget *this_00;
  long lVar6;
  long in_FS_OFFSET;
  GestureType local_3c;
  TryEmplaceResult local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = gesture;
  QGestureManager::instance(ForceCreation);
  QHash<Qt::GestureType,int>::tryEmplace_impl<Qt::GestureType_const&>
            (&local_38,&this->grabbedGestures,&local_3c);
  pEVar3 = (local_38.iterator.i.d)->spans[local_38.iterator.i.bucket >> 7].entries;
  bVar1 = (local_38.iterator.i.d)->spans[local_38.iterator.i.bucket >> 7].offsets
          [(uint)local_38.iterator.i.bucket & 0x7f];
  iVar2 = *(int *)(pEVar3[bVar1].storage.data + 4);
  *(int *)(pEVar3[bVar1].storage.data + 4) = iVar2 + 1;
  if ((iVar2 == 0) && (lVar4 = (this->views).d.size, lVar4 != 0)) {
    ppQVar5 = (this->views).d.ptr;
    lVar6 = 0;
    do {
      this_00 = QAbstractScrollArea::viewport(*(QAbstractScrollArea **)((long)ppQVar5 + lVar6));
      QWidget::grabGesture(this_00,local_3c,(GestureFlags)0x0);
      lVar6 = lVar6 + 8;
    } while (lVar4 << 3 != lVar6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::grabGesture(QGraphicsItem *, Qt::GestureType gesture)
{
    (void)QGestureManager::instance(); // create a gesture manager
    if (!grabbedGestures[gesture]++) {
        for (QGraphicsView *view : std::as_const(views))
            view->viewport()->grabGesture(gesture);
    }
}